

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O0

ShaderCodeBufferDesc * __thiscall
Diligent::ShaderGLImpl::GetConstantBufferDesc(ShaderGLImpl *this,Uint32 Index)

{
  undefined *puVar1;
  undefined4 uVar2;
  bool bVar3;
  Uint32 UVar4;
  DeviceFeatures *pDVar5;
  Char *pCVar6;
  element_type *this_00;
  undefined8 uVar7;
  char (*in_R8) [18];
  undefined1 local_90 [8];
  string _msg;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  Uint32 Index_local;
  ShaderGLImpl *this_local;
  
  msg.field_2._12_4_ = Index;
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_Builder);
  if (bVar3) {
    FormatString<char[109]>
              ((string *)local_40,
               (char (*) [109])
               "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"GetConstantBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x1aa);
    std::__cxx11::string::~string((string *)local_40);
  }
  pDVar5 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetFeatures
                     (&((this->super_ShaderBase<Diligent::EngineGLImplTraits>).
                        super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                       .m_pDevice)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  uVar2 = msg.field_2._12_4_;
  if (pDVar5->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[87]>
              ((string *)local_90,
               (char (*) [87])
               "Shader resource queries are not available when separate shader objects are unsupported"
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar7 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar7,0);
    }
    std::__cxx11::string::~string((string *)local_90);
    this_local = (ShaderGLImpl *)0x0;
  }
  else {
    UVar4 = GetResourceCount(this);
    if ((uint)uVar2 < UVar4) {
      this_00 = std::
                __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_pShaderResources);
      this_local = (ShaderGLImpl *)
                   ShaderResourcesGL::GetUniformBufferDesc(this_00,msg.field_2._12_4_);
    }
    else {
      FormatString<char[24],unsigned_int,char[18]>
                ((string *)((long)&_msg.field_2 + 8),(Diligent *)"Constant buffer index (",
                 (char (*) [24])((long)&msg.field_2 + 0xc),(uint *)") is out of range",in_R8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"GetConstantBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x1b0);
      std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
      this_local = (ShaderGLImpl *)0x0;
    }
  }
  return (ShaderCodeBufferDesc *)this_local;
}

Assistant:

const ShaderCodeBufferDesc* ShaderGLImpl::GetConstantBufferDesc(Uint32 Index) const
{
    DEV_CHECK_ERR(!m_Builder, "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");

    if (m_pDevice->GetFeatures().SeparablePrograms)
    {
        if (Index >= GetResourceCount())
        {
            UNEXPECTED("Constant buffer index (", Index, ") is out of range");
            return nullptr;
        }

        // Uniform buffers always go first in the list of resources
        return m_pShaderResources->GetUniformBufferDesc(Index);
    }
    else
    {
        LOG_WARNING_MESSAGE("Shader resource queries are not available when separate shader objects are unsupported");
        return nullptr;
    }
}